

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

int AF_AActor_HitWater(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                      VMReturn *ret,int numret)

{
  AActor *thing;
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  PClass *pPVar3;
  VMValue *pVVar4;
  VMValue *pVVar5;
  sector_t *sec;
  char *pcVar6;
  bool bVar7;
  DVector3 local_48;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar6 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      thing = (AActor *)(param->field_0).field_1.a;
      if (thing != (AActor *)0x0) {
        if ((thing->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar2 = (**(thing->super_DThinker).super_DObject._vptr_DObject)(thing);
          (thing->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
        }
        pPVar3 = (thing->super_DThinker).super_DObject.Class;
        bVar7 = pPVar3 != (PClass *)0x0;
        if (pPVar3 != pPVar1 && bVar7) {
          do {
            pPVar3 = pPVar3->ParentClass;
            bVar7 = pPVar3 != (PClass *)0x0;
            if (pPVar3 == pPVar1) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if (!bVar7) {
          pcVar6 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0042fe2f;
        }
      }
      if (numparam == 1) {
        pcVar6 = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\x03') {
          sec = (sector_t *)param[1].field_0.field_1.a;
          if (sec == (sector_t *)0x0) {
            NullParam("\"sec\"");
            sec = (sector_t *)param[1].field_0.field_1.a;
          }
          if (numparam < 3) {
            pcVar6 = "(paramnum) < numparam";
          }
          else {
            if (param[2].field_0.field_3.Type == '\x01') {
              if (numparam == 3) {
                pcVar6 = "(paramnum) < numparam";
              }
              else {
                if (param[3].field_0.field_3.Type == '\x01') {
                  if (numparam < 5) {
                    pcVar6 = "(paramnum) < numparam";
                  }
                  else {
                    if (param[4].field_0.field_3.Type == '\x01') {
                      local_48.X = (double)param[2].field_0.field_1.a;
                      local_48.Y = (double)param[3].field_0.field_1.a;
                      local_48.Z = (double)param[4].field_0.field_1.a;
                      if (numparam == 5) {
                        pVVar4 = defaultparam->Array;
                        if (defaultparam->Array[5].field_0.field_3.Type != '\0') {
                          pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_0042fe8c:
                          __assert_fail(pcVar6,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                                        ,0x181f,
                                        "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                       );
                        }
                      }
                      else {
                        pVVar4 = param;
                        if (param[5].field_0.field_3.Type != '\0') {
                          pcVar6 = "(param[paramnum]).Type == REGT_INT";
                          goto LAB_0042fe8c;
                        }
                      }
                      if (numparam < 7) {
                        pVVar5 = defaultparam->Array;
                        if (pVVar5[6].field_0.field_3.Type != '\0') {
                          pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
                          goto LAB_0042feab;
                        }
                      }
                      else {
                        pVVar5 = param;
                        if (param[6].field_0.field_3.Type != '\0') {
                          pcVar6 = "(param[paramnum]).Type == REGT_INT";
LAB_0042feab:
                          __assert_fail(pcVar6,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                                        ,0x1820,
                                        "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                       );
                        }
                      }
                      if (numparam < 8) {
                        param = defaultparam->Array;
                        if (param[7].field_0.field_3.Type == '\0') goto LAB_0042fd02;
                        pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
                      }
                      else {
                        if (param[7].field_0.field_3.Type == '\0') {
LAB_0042fd02:
                          bVar7 = P_HitWater(thing,sec,&local_48,pVVar4[5].field_0.i != 0,
                                             pVVar5[6].field_0.i != 0,param[7].field_0.i != 0);
                          if (numret < 1) {
                            iVar2 = 0;
                          }
                          else {
                            if (ret == (VMReturn *)0x0) {
                              __assert_fail("ret != NULL",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                                            ,0x1822,
                                            "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                           );
                            }
                            if (ret->RegType != '\0') {
                              __assert_fail("RegType == REGT_INT",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                                            ,0x13f,"void VMReturn::SetInt(int)");
                            }
                            *(uint *)ret->Location = (uint)bVar7;
                            iVar2 = 1;
                          }
                          return iVar2;
                        }
                        pcVar6 = "(param[paramnum]).Type == REGT_INT";
                      }
                      __assert_fail(pcVar6,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                                    ,0x1821,
                                    "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                   );
                    }
                    pcVar6 = "param[paramnum].Type == REGT_FLOAT";
                  }
                  __assert_fail(pcVar6,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                                ,0x181e,
                                "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
                pcVar6 = "param[paramnum].Type == REGT_FLOAT";
              }
              __assert_fail(pcVar6,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                            ,0x181d,
                            "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            pcVar6 = "param[paramnum].Type == REGT_FLOAT";
          }
          __assert_fail(pcVar6,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x181c,
                        "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar6 = "param[paramnum].Type == REGT_POINTER";
      }
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x181b,
                    "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_0042fe2f:
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x181a,"int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, HitWater)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_POINTER_NOT_NULL(sec, sector_t);
	PARAM_FLOAT(x);
	PARAM_FLOAT(y);
	PARAM_FLOAT(z);
	PARAM_BOOL_DEF(checkabove);
	PARAM_BOOL_DEF(alert);
	PARAM_BOOL_DEF(force);
	ACTION_RETURN_BOOL(P_HitWater(self, sec, DVector3(x, y, z), checkabove, alert, force));
}